

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::(anonymous_namespace)::ImmovableInt>::~Array
          (Array<kj::(anonymous_namespace)::ImmovableInt> *this)

{
  ImmovableInt *pIVar1;
  size_t sVar2;
  
  pIVar1 = this->ptr;
  if (pIVar1 != (ImmovableInt *)0x0) {
    sVar2 = this->size_;
    this->ptr = (ImmovableInt *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pIVar1,4,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }